

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int formparse(OperationConfig *config,char *input,tool_mime **mimeroot,tool_mime **mimecurrent,
             _Bool literal_value)

{
  char *__s1;
  char cVar1;
  GlobalConfig *pGVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  tool_mime *ptVar6;
  char *pcVar7;
  char *pcVar8;
  tool_mime *ptVar9;
  OperationConfig *config_00;
  curl_slist *headers;
  CURLcode res;
  char *type;
  char *data;
  char *local_60;
  OperationConfig *local_58;
  char *encoder;
  char *filename;
  char *local_40;
  char *local_38;
  
  type = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  local_58 = config;
  if (*mimecurrent == (tool_mime *)0x0) {
    ptVar6 = (tool_mime *)calloc(1,0x70);
    if (ptVar6 != (tool_mime *)0x0) {
      ptVar6->kind = TOOLMIME_PARTS;
      ptVar6->parent = (tool_mime *)0x0;
      *mimeroot = ptVar6;
      *mimecurrent = ptVar6;
      goto LAB_0010dcbf;
    }
    *mimeroot = (tool_mime *)0x0;
  }
  else {
LAB_0010dcbf:
    pcVar7 = strdup(input);
    iVar5 = 1;
    if (pcVar7 != (char *)0x0) {
      pcVar8 = strchr(pcVar7,0x3d);
      if (pcVar8 == (char *)0x0) {
        local_60 = pcVar8;
        warnf(local_58->global,"Illegally formatted input field");
        goto LAB_0010de31;
      }
      local_38 = (char *)0x0;
      if (pcVar7 < pcVar8) {
        local_38 = pcVar7;
      }
      __s1 = pcVar8 + 1;
      *pcVar8 = '\0';
      cVar1 = pcVar8[1];
      local_60 = __s1;
      local_40 = pcVar7;
      if (cVar1 == '(' && !literal_value) {
        iVar5 = get_param_part(local_58,'\0',&local_60,&data,&type,(char **)0x0,(char **)0x0,
                               &headers);
        bVar4 = true;
        if ((-1 < iVar5) && (ptVar6 = tool_mime_new_parts(*mimecurrent), ptVar6 != (tool_mime *)0x0)
           ) {
          *mimecurrent = ptVar6;
          ptVar6->headers = headers;
          headers = (curl_slist *)0x0;
          if (type != (char *)0x0) {
            pcVar7 = strdup(type);
            ptVar6->type = pcVar7;
            if (pcVar7 == (char *)0x0) goto LAB_0010e225;
          }
          goto LAB_0010e202;
        }
      }
      else if ((local_38 != (char *)0x0) || (iVar5 = strcmp(__s1,")"), iVar5 != 0 || literal_value))
      {
        config_00 = local_58;
        if (cVar1 == '@' && !literal_value) {
          local_60 = local_60 + 1;
          iVar5 = get_param_part(local_58,',',&local_60,&data,&type,&filename,&encoder,&headers);
          bVar4 = true;
          if (iVar5 < 0) {
LAB_0010e08b:
            ptVar6 = (tool_mime *)0x0;
          }
          else {
            ptVar9 = (tool_mime *)0x0;
            ptVar6 = (tool_mime *)0x0;
            do {
              if (((ptVar9 == (tool_mime *)0x0) && (ptVar9 = *mimecurrent, iVar5 == 0x2c)) &&
                 (ptVar9 = tool_mime_new_parts(ptVar9), ptVar9 == (tool_mime *)0x0)) break;
              ptVar6 = tool_mime_new_filedata(ptVar9,data,true,&res);
              if (ptVar6 == (tool_mime *)0x0) goto LAB_0010e08b;
              ptVar6->headers = headers;
              headers = (curl_slist *)0x0;
              pGVar2 = config_00->global;
              ptVar6->config = pGVar2;
              if (res == CURLE_READ_ERROR) {
                if (0 < ptVar6->size) {
                  bVar3 = false;
                  warnf(pGVar2,"error while reading standard input");
                  goto LAB_0010e08f;
                }
                free(ptVar6->data);
                ptVar6->data = (char *)0x0;
                ptVar6->size = -1;
                res = CURLE_OK;
              }
              if (filename != (char *)0x0) {
                pcVar7 = strdup(filename);
                ptVar6->filename = pcVar7;
                if (pcVar7 == (char *)0x0) break;
              }
              if (type != (char *)0x0) {
                pcVar7 = strdup(type);
                ptVar6->type = pcVar7;
                if (pcVar7 == (char *)0x0) break;
              }
              if (encoder != (char *)0x0) {
                pcVar7 = strdup(encoder);
                ptVar6->encoder = pcVar7;
                if (pcVar7 == (char *)0x0) break;
              }
              if (iVar5 == 0) {
                ptVar6 = (*mimecurrent)->subparts;
                bVar4 = false;
                bVar3 = true;
                goto LAB_0010e08f;
              }
              local_60 = local_60 + 1;
              iVar5 = get_param_part(config_00,',',&local_60,&data,&type,&filename,&encoder,&headers
                                    );
            } while (-1 < iVar5);
          }
          bVar3 = false;
LAB_0010e08f:
          if (bVar3) goto LAB_0010e202;
          goto LAB_0010e225;
        }
        if (cVar1 == '<' && !literal_value) {
          local_60 = pcVar8 + 2;
          iVar5 = get_param_part(local_58,'\0',&local_60,&data,&type,(char **)0x0,&encoder,&headers)
          ;
          bVar4 = true;
          if ((iVar5 < 0) ||
             (ptVar6 = tool_mime_new_filedata(*mimecurrent,data,false,&res),
             ptVar6 == (tool_mime *)0x0)) goto LAB_0010e225;
          ptVar6->headers = headers;
          headers = (curl_slist *)0x0;
          pGVar2 = config_00->global;
          ptVar6->config = pGVar2;
          if (res == CURLE_READ_ERROR) {
            if (0 < ptVar6->size) {
              warnf(pGVar2,"error while reading standard input");
              goto LAB_0010e225;
            }
            free(ptVar6->data);
            ptVar6->data = (char *)0x0;
            ptVar6->size = -1;
            res = CURLE_OK;
          }
        }
        else {
          if (literal_value) {
            iVar5 = 0;
            data = __s1;
          }
          else {
            iVar5 = get_param_part(local_58,'\0',&local_60,&data,&type,&filename,&encoder,&headers);
            if (iVar5 < 0) goto LAB_0010e21f;
          }
          ptVar9 = *mimecurrent;
          pcVar7 = strdup(data);
          if (pcVar7 == (char *)0x0) {
LAB_0010e176:
            ptVar6 = (tool_mime *)0x0;
          }
          else {
            ptVar6 = (tool_mime *)calloc(1,0x70);
            if (ptVar6 == (tool_mime *)0x0) {
              free(pcVar7);
              goto LAB_0010e176;
            }
            ptVar6->kind = TOOLMIME_DATA;
            ptVar6->parent = ptVar9;
            if (ptVar9 != (tool_mime *)0x0) {
              ptVar6->prev = ptVar9->subparts;
              ptVar9->subparts = ptVar6;
            }
            ptVar6->data = pcVar7;
          }
          if (ptVar6 == (tool_mime *)0x0) goto LAB_0010e21f;
          ptVar6->headers = headers;
          headers = (curl_slist *)0x0;
          config_00 = local_58;
        }
        if (filename != (char *)0x0) {
          pcVar7 = strdup(filename);
          ptVar6->filename = pcVar7;
          if (pcVar7 == (char *)0x0) goto LAB_0010e21f;
        }
        if (type != (char *)0x0) {
          pcVar7 = strdup(type);
          ptVar6->type = pcVar7;
          if (pcVar7 == (char *)0x0) goto LAB_0010e21f;
        }
        if (encoder != (char *)0x0) {
          pcVar7 = strdup(encoder);
          ptVar6->encoder = pcVar7;
          if (pcVar7 == (char *)0x0) goto LAB_0010e21f;
        }
        if (iVar5 != 0) {
          *local_60 = (char)iVar5;
          warnf(config_00->global,"garbage at end of field specification: %s");
        }
LAB_0010e202:
        if (local_38 != (char *)0x0) {
          pcVar7 = strdup(local_38);
          ptVar6->name = pcVar7;
          if (pcVar7 == (char *)0x0) goto LAB_0010e21f;
        }
        bVar4 = false;
      }
      else {
        if (*mimecurrent != *mimeroot) {
          *mimecurrent = (*mimecurrent)->parent;
          ptVar6 = (tool_mime *)0x0;
          goto LAB_0010e202;
        }
        warnf(local_58->global,"no multipart to terminate");
LAB_0010e21f:
        bVar4 = true;
      }
LAB_0010e225:
      pcVar7 = local_40;
      if (bVar4) {
        iVar5 = 1;
        if (!bVar4) {
          return 1;
        }
      }
      else {
        iVar5 = 0;
      }
      goto LAB_0010de31;
    }
  }
  iVar5 = 1;
  pcVar7 = (char *)0x0;
LAB_0010de31:
  free(pcVar7);
  curl_slist_free_all(headers);
  return iVar5;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              struct tool_mime **mimeroot,
              struct tool_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we will
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  struct tool_mime *part = NULL;
  CURLcode res;
  int err = 1;

  /* Allocate the main mime structure if needed. */
  if(!*mimecurrent) {
    *mimeroot = tool_mime_new_parts(NULL);
    if(!*mimeroot)
      goto fail;
    *mimecurrent = *mimeroot;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents)
    goto fail;

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    int sep = '\0';
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0)
        goto fail;
      part = tool_mime_new_parts(*mimecurrent);
      if(!part)
        goto fail;
      *mimecurrent = part;
      part->headers = headers;
      headers = NULL;
      SET_TOOL_MIME_PTR(part, type);
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a multipart. */
      if(*mimecurrent == *mimeroot) {
        warnf(config->global, "no multipart to terminate");
        goto fail;
      }
      *mimecurrent = (*mimecurrent)->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate filename(s) */

      struct tool_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          goto fail;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = tool_mime_new_parts(*mimecurrent);
            if(!subparts)
              goto fail;
          }
        }

        /* Store that file in a part. */
        part = tool_mime_new_filedata(subparts, data, TRUE, &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
        SET_TOOL_MIME_PTR(part, filename);
        SET_TOOL_MIME_PTR(part, type);
        SET_TOOL_MIME_PTR(part, encoder);

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there is another filename */
      part = (*mimecurrent)->subparts;  /* Set name on group. */
    }
    else {
      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0)
          goto fail;

        part = tool_mime_new_filedata(*mimecurrent, data, FALSE,
                                      &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0)
            goto fail;
        }

        part = tool_mime_new_data(*mimecurrent, data);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
      }

      SET_TOOL_MIME_PTR(part, filename);
      SET_TOOL_MIME_PTR(part, type);
      SET_TOOL_MIME_PTR(part, encoder);

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s", contp);
      }
    }

    /* Set part name. */
    SET_TOOL_MIME_PTR(part, name);
  }
  else {
    warnf(config->global, "Illegally formatted input field");
    goto fail;
  }
  err = 0;
fail:
  curlx_safefree(contents);
  curl_slist_free_all(headers);
  return err;
}